

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O2

bool __thiscall
libtorrent::dht::all_in_same_bucket
          (dht *this,span<const_libtorrent::dht::node_entry> b,node_id *id,int bucket_index)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int counter [2];
  
  uVar3 = 0x80 >> ((byte)id & 7);
  counter[0] = 0;
  counter[1] = 0;
  lVar1 = (long)(int)((long)((ulong)(uint)((int)id >> 0x1f) << 0x20 | (ulong)id & 0xffffffff) / 8);
  counter[(uVar3 & *(byte *)(b.m_len + lVar1)) != 0] =
       counter[(uVar3 & *(byte *)(b.m_len + lVar1)) != 0] + 1;
  for (lVar2 = 0; (long)b.m_ptr * 0x40 != lVar2; lVar2 = lVar2 + 0x40) {
    counter[(uVar3 & (byte)this[lVar2 + lVar1 + 0x10]) != 0] =
         counter[(uVar3 & (byte)this[lVar2 + lVar1 + 0x10]) != 0] + 1;
  }
  return counter[1] == 0 || counter[0] == 0;
}

Assistant:

bool all_in_same_bucket(span<node_entry const> b, node_id const& id, int const bucket_index)
{
	int const byte_offset = bucket_index / 8;
	int const bit_offset = bucket_index % 8;
	std::uint8_t const mask = 0x80 >> bit_offset;
	int counter[2] = {0, 0};
	int const i =  (id[byte_offset] & mask) ? 1 : 0;
	++counter[i];
	for (auto const& e : b)
	{
		int const idx =  (e.id[byte_offset] & mask) ? 1 : 0;
		++counter[idx];
	}
	return counter[0] == 0 || counter[1] == 0;
}